

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

intptr_t last_active_element(uint64_t *g,intptr_t words,intptr_t esz)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t this_g;
  intptr_t i;
  uint64_t mask;
  intptr_t esz_local;
  intptr_t words_local;
  uint64_t *g_local;
  
  this_g = words;
  do {
    uVar2 = this_g - 1;
    if ((g[this_g - 1] & pred_esz_masks_aarch64[esz]) != 0) {
      iVar1 = clz64(g[this_g - 1] & pred_esz_masks_aarch64[esz]);
      return uVar2 * 0x40 + (long)(0x3f - iVar1);
    }
    this_g = uVar2;
  } while (0 < (long)uVar2);
  return -1L << ((byte)esz & 0x3f);
}

Assistant:

static intptr_t last_active_element(uint64_t *g, intptr_t words, intptr_t esz)
{
    uint64_t mask = pred_esz_masks[esz];
    intptr_t i = words;

    do {
        uint64_t this_g = g[--i] & mask;
        if (this_g) {
            return i * 64 + (63 - clz64(this_g));
        }
    } while (i > 0);
    return (intptr_t)-1 << esz;
}